

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O0

void __thiscall
ptc::Print<char>::
print_backend<std::ostream&,char_const(&)[8],char_const(&)[5],char_const(&)[8],int>
          (Print<char> *this,basic_ostream<char,_std::char_traits<char>_> *os,char (*first) [8],
          char (*args) [5],char (*args_1) [8],int *args_2)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  bool local_14b;
  bool local_14a;
  bool local_149;
  byte local_69;
  ANSI local_68 [9];
  ANSI local_44;
  lock_guard<std::mutex> local_40;
  lock_guard<std::mutex> lock;
  int *args_local_2;
  char (*args_local_1) [8];
  char (*args_local) [5];
  char (*first_local) [8];
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  Print<char> *this_local;
  
  lock._M_device = (mutex_type *)args_2;
  std::lock_guard<std::mutex>::lock_guard(&local_40,(mutex_type *)mutex_);
  local_44 = first;
  bVar1 = is_escape<char[8]>(first,&local_44);
  local_69 = 1;
  if (!bVar1) {
    local_69 = std::__cxx11::string::empty();
  }
  if ((local_69 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)os,(string *)&this->pattern);
    poVar2 = std::operator<<(poVar2,*first);
    std::operator<<(poVar2,(string *)&this->pattern);
  }
  else {
    std::operator<<((ostream *)os,*first);
  }
  local_68[4] = 0;
  bVar1 = is_escape<char[8]>(first,local_68 + 4);
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)os,(string *)&this->pattern);
      poVar2 = std::operator<<(poVar2,*args);
      poVar2 = std::operator<<(poVar2,(string *)&this->pattern);
      std::operator<<(poVar2,(string *)&this->sep);
      poVar2 = std::operator<<((ostream *)os,(string *)&this->pattern);
      poVar2 = std::operator<<(poVar2,*args_1);
      poVar2 = std::operator<<(poVar2,(string *)&this->pattern);
      std::operator<<(poVar2,(string *)&this->sep);
      poVar2 = std::operator<<((ostream *)os,(string *)&this->pattern);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,((lock._M_device)->super___mutex_base)._M_mutex.__data.__lock);
      poVar2 = std::operator<<(poVar2,(string *)&this->pattern);
      std::operator<<(poVar2,(string *)&this->sep);
    }
    else {
      poVar2 = std::operator<<((ostream *)os,*args);
      std::operator<<(poVar2,(string *)&this->sep);
      poVar2 = std::operator<<((ostream *)os,*args_1);
      std::operator<<(poVar2,(string *)&this->sep);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)os,
                          ((lock._M_device)->super___mutex_base)._M_mutex.__data.__lock);
      std::operator<<(poVar2,(string *)&this->sep);
    }
  }
  else {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)os,(string *)&this->sep);
      poVar2 = std::operator<<(poVar2,(string *)&this->pattern);
      poVar2 = std::operator<<(poVar2,*args);
      std::operator<<(poVar2,(string *)&this->pattern);
      poVar2 = std::operator<<((ostream *)os,(string *)&this->sep);
      poVar2 = std::operator<<(poVar2,(string *)&this->pattern);
      poVar2 = std::operator<<(poVar2,*args_1);
      std::operator<<(poVar2,(string *)&this->pattern);
      poVar2 = std::operator<<((ostream *)os,(string *)&this->sep);
      poVar2 = std::operator<<(poVar2,(string *)&this->pattern);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,((lock._M_device)->super___mutex_base)._M_mutex.__data.__lock);
      std::operator<<(poVar2,(string *)&this->pattern);
    }
    else {
      poVar2 = std::operator<<((ostream *)os,(string *)&this->sep);
      std::operator<<(poVar2,*args);
      poVar2 = std::operator<<((ostream *)os,(string *)&this->sep);
      std::operator<<(poVar2,*args_1);
      poVar2 = std::operator<<((ostream *)os,(string *)&this->sep);
      std::ostream::operator<<(poVar2,((lock._M_device)->super___mutex_base)._M_mutex.__data.__lock)
      ;
    }
  }
  std::operator<<((ostream *)os,(string *)this);
  local_68[3] = 1;
  bVar1 = is_escape<char[8]>(first,local_68 + 3);
  local_149 = true;
  if (!bVar1) {
    local_68[2] = 1;
    bVar1 = is_escape<char[5]>(args,local_68 + 2);
    local_14a = true;
    if (!bVar1) {
      local_68[1] = 1;
      bVar1 = is_escape<char[8]>(args_1,local_68 + 1);
      local_14b = true;
      if (!bVar1) {
        local_68[0] = generic;
        local_14b = is_escape<int>((int *)lock._M_device,local_68);
      }
      local_14a = local_14b;
    }
    local_149 = local_14a;
  }
  if (local_149 != false) {
    std::operator<<((ostream *)os,"\x1b[0m");
  }
  if ((this->flush & 1U) != 0) {
    std::ostream::operator<<((ostream *)os,std::flush<char,std::char_traits<char>>);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_40);
  return;
}

Assistant:

void print_backend( T_os&& os, T&& first, Args&&... args ) const
     {
      std::lock_guard <std::mutex> lock{ mutex_ };

      // Printing the first argument
      if( is_escape( first, ANSI::first ) || pattern.empty() ) os << first;
      else os << pattern << first << pattern;
      
      // Printing all the other arguments
      if constexpr( sizeof...( args ) > 0 ) 
       {
        if ( is_escape( first, ANSI::first ) ) 
         {
          if( pattern.empty() ) ( ( os << args << sep ), ...);
          else ( ( os << pattern << args << pattern << sep ), ...);
         }
        else 
         {
          if( pattern.empty() ) ( ( os << sep << args ), ...);
          else ( ( os << sep << pattern << args << pattern ), ...);
         }
       }
      os << end;
      
      // Resetting the stream from ANSI escape sequences
      if constexpr( sizeof...( args ) > 0 )
       {
        if ( is_escape( first, ANSI::generic ) || ( ( is_escape( args, ANSI::generic ) ) || ...) )
         {
          os << "\033[0m";
         }
       }
      else 
       {
       if ( is_escape( first, ANSI::generic ) ) 
        {
         os << "\033[0m";
        }
       }

      // Other operations
      if ( flush ) os << std::flush;
     }